

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

int nonius::run_it(configuration *cfg)

{
  configuration cStack_158;
  
  configuration::configuration(&cStack_158,cfg);
  if (global_benchmark_registry()::registry == '\0') {
    run_it();
  }
  if (global_reporter_registry[abi:cxx11]()::registry_abi_cxx11_ == '\0') {
    run_it();
  }
  go<std::chrono::_V2::system_clock>
            (&cStack_158,(benchmark_registry *)&global_benchmark_registry()::registry,
             (reporter_registry *)global_reporter_registry[abi:cxx11]()::registry_abi_cxx11_);
  optional<nonius::run_configuration>::destroy(&cStack_158.params.run);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&cStack_158.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_158.filter_pattern._M_dataplus._M_p != &cStack_158.filter_pattern.field_2) {
    operator_delete(cStack_158.filter_pattern._M_dataplus._M_p,
                    cStack_158.filter_pattern.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_158.reporter._M_dataplus._M_p != &cStack_158.reporter.field_2) {
    operator_delete(cStack_158.reporter._M_dataplus._M_p,
                    cStack_158.reporter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_158.output_file._M_dataplus._M_p != &cStack_158.output_file.field_2) {
    operator_delete(cStack_158.output_file._M_dataplus._M_p,
                    cStack_158.output_file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_158.title._M_dataplus._M_p != &cStack_158.title.field_2) {
    operator_delete(cStack_158.title._M_dataplus._M_p,
                    cStack_158.title.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

inline int run_it(configuration cfg) {
        try {
            nonius::go(cfg);
        } catch(...) {
            std::cerr << "PANIC: clock is on fire\n";
            try {
                throw;
            } catch(std::exception const& e) {
                std::cerr << "  " << e.what() << "\n";
            } catch(...) {}
            return 23;
        }
        return 0;
    }